

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_3>::Read_Last_Frame(Driver<float,_3> *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string filename;
  Driver<float,_3> *this_local;
  
  std::operator+(local_30,(char *)&this->example->output_directory);
  bVar1 = File_Utilities::File_Exists(local_30,true);
  if (bVar1) {
    File_Utilities::Read_From_Text_File<int>(local_30,&this->example->restart_frame);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Driver<T,d>::
Read_Last_Frame()
{
    std::string filename=example.output_directory+"/common/last_frame";
    if(File_Utilities::File_Exists(filename))
        File_Utilities::Read_From_Text_File(filename,example.restart_frame);
}